

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdEmuD3D56TexFilter::~MthdEmuD3D56TexFilter(MthdEmuD3D56TexFilter *this)

{
  MthdEmuD3D56TexFilter *this_local;
  
  ~MthdEmuD3D56TexFilter(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			if (rnd() & 3)
				insrt(val, 5, 3, 0);
			if (rnd() & 3)
				insrt(val, 13, 2, 0);
		}
		adjust_orig_icmd(&orig);
	}